

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

bool __thiscall Debugger::GetStacks(Debugger *this,vector<Stack,_std::allocator<Stack>_> *stacks)

{
  lua_State *L_00;
  ArenaClass *pAVar1;
  int iVar2;
  char *pcVar3;
  element_type *peVar4;
  Variable *pVVar5;
  element_type *peVar6;
  Idx<Variable> IVar7;
  Idx<Variable> variable;
  char *local_528;
  lua_State *PL;
  undefined1 local_500 [8];
  Idx<Variable> var_1;
  char *name_1;
  int i_1;
  int fIdx;
  undefined1 local_4d0 [8];
  Idx<Variable> var;
  char *name;
  undefined1 local_4b0 [4];
  int i;
  reference local_490;
  value_type *stack;
  lua_Debug ar;
  int level;
  int totalLevel;
  lua_State *L;
  lua_State *prevCurrentL;
  vector<Stack,_std::allocator<Stack>_> *stacks_local;
  Debugger *this_local;
  
  if (this->currentL != (lua_State *)0x0) {
    L_00 = this->currentL;
    _level = this->currentL;
    ar.u._1100_4_ = 0;
    do {
      ar.u._1096_4_ = 0;
      while( true ) {
        memset(&stack,0,0x450);
        iVar2 = (*lua_getstack)(_level,ar.u._1096_4_,(lua_Debug *)&stack);
        if (iVar2 == 0) break;
        iVar2 = (*lua_getinfo)(_level,"nSlu",(lua_Debug *)&stack);
        if (iVar2 != 0) {
          std::vector<Stack,_std::allocator<Stack>_>::emplace_back<>(stacks);
          local_490 = std::vector<Stack,_std::allocator<Stack>_>::back(stacks);
          GetFile_abi_cxx11_((string *)local_4b0,this,(lua_Debug *)&stack);
          std::__cxx11::string::operator=((string *)&local_490->file,(string *)local_4b0);
          std::__cxx11::string::~string((string *)local_4b0);
          pcVar3 = getDebugName((lua_Debug *)&stack);
          if (pcVar3 == (char *)0x0) {
            local_528 = "";
          }
          else {
            local_528 = getDebugName((lua_Debug *)&stack);
          }
          std::__cxx11::string::operator=((string *)&local_490->functionName,local_528);
          local_490->level = ar.u._1100_4_;
          ar.u._1100_4_ = ar.u._1100_4_ + 1;
          iVar2 = getDebugCurrentLine((lua_Debug *)&stack);
          local_490->line = iVar2;
          name._4_4_ = 1;
          while (var._arena = (ArenaClass *)(*lua_getlocal)(_level,(lua_Debug *)&stack,name._4_4_),
                var._arena != (ArenaClass *)0x0) {
            if (*(char *)&((var._arena)->_data).
                          super__Vector_base<Variable,_std::allocator<Variable>_>._M_impl.
                          super__Vector_impl_data._M_start == '(') {
              (*lua_settop)(_level,-2);
            }
            else {
              peVar4 = std::
                       __shared_ptr_access<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&local_490->variableArena);
              IVar7 = Arena<Variable>::Alloc(peVar4);
              pAVar1 = var._arena;
              var._0_8_ = IVar7._arena;
              local_4d0._0_4_ = IVar7.Raw;
              pVVar5 = Idx<Variable>::operator->((Idx<Variable> *)local_4d0);
              std::__cxx11::string::operator=((string *)&pVVar5->name,(char *)pAVar1);
              peVar6 = std::__shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>::get
                                 (&(local_490->variableArena).
                                   super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>);
              SetVariableArena(this,peVar6);
              variable._4_4_ = 0;
              variable.Raw = local_4d0._0_4_;
              variable._arena = (ArenaClass *)var._0_8_;
              GetVariable(this,_level,variable,-1,1,true);
              ClearVariableArenaRef(this);
              (*lua_settop)(_level,-2);
              std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                        (&local_490->localVariables,(value_type *)local_4d0);
            }
            name._4_4_ = name._4_4_ + 1;
          }
          iVar2 = (*lua_getinfo)(_level,"f",(lua_Debug *)&stack);
          if (iVar2 != 0) {
            iVar2 = (*lua_gettop)(_level);
            name_1._0_4_ = 1;
            while (var_1._arena = (ArenaClass *)(*lua_getupvalue)(_level,iVar2,(int)name_1),
                  var_1._arena != (ArenaClass *)0x0) {
              peVar4 = std::
                       __shared_ptr_access<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&local_490->variableArena);
              IVar7 = Arena<Variable>::Alloc(peVar4);
              pAVar1 = var_1._arena;
              var_1._0_8_ = IVar7._arena;
              local_500._0_4_ = IVar7.Raw;
              pVVar5 = Idx<Variable>::operator->((Idx<Variable> *)local_500);
              std::__cxx11::string::operator=((string *)&pVVar5->name,(char *)pAVar1);
              peVar6 = std::__shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>::get
                                 (&(local_490->variableArena).
                                   super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>);
              SetVariableArena(this,peVar6);
              IVar7._4_4_ = 0;
              IVar7.Raw = local_500._0_4_;
              IVar7._arena = (ArenaClass *)var_1._0_8_;
              GetVariable(this,_level,IVar7,-1,1,true);
              ClearVariableArenaRef(this);
              (*lua_settop)(_level,-2);
              std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                        (&local_490->upvalueVariables,(value_type *)local_500);
              name_1._0_4_ = (int)name_1 + 1;
            }
            (*lua_settop)(_level,-2);
          }
          ar.u._1096_4_ = ar.u._1096_4_ + 1;
        }
      }
      _level = ExtensionPoint::QueryParentThread(&this->manager->extension,_level);
    } while (_level != (lua_State *)0x0);
    SetCurrentState(this,L_00);
  }
  return false;
}

Assistant:

bool Debugger::GetStacks(std::vector<Stack> &stacks) {
	if (!currentL) {
		return false;
	}

	auto prevCurrentL = currentL;
	auto L = currentL;

	int totalLevel = 0;
	while (true) {
		int level = 0;
		while (true) {
			lua_Debug ar{};
			if (!lua_getstack(L, level, &ar)) {
				break;
			}
			if (!lua_getinfo(L, "nSlu", &ar)) {
				continue;
			}
			// C++ 17 only return T&
			stacks.emplace_back();
			auto &stack = stacks.back();
			stack.file = GetFile(&ar);
			stack.functionName = getDebugName(&ar) == nullptr ? "" : getDebugName(&ar);
			stack.level = totalLevel++;
			stack.line = getDebugCurrentLine(&ar);

			// get variables
			{
				for (int i = 1;; i++) {
					const char *name = lua_getlocal(L, &ar, i);
					if (name == nullptr) {
						break;
					}
					if (name[0] == '(') {
						lua_pop(L, 1);
						continue;
					}

					// add local variable
					auto var = stack.variableArena->Alloc();
					var->name = name;
					SetVariableArena(stack.variableArena.get());
					GetVariable(L, var, -1, 1);
					ClearVariableArenaRef();
					lua_pop(L, 1);
					stack.localVariables.push_back(var);
				}

				if (lua_getinfo(L, "f", &ar)) {
					const int fIdx = lua_gettop(L);
					for (int i = 1;; i++) {
						const char *name = lua_getupvalue(L, fIdx, i);
						if (!name) {
							break;
						}

						// add up variable
						auto var = stack.variableArena->Alloc();
						var->name = name;
						SetVariableArena(stack.variableArena.get());
						GetVariable(L, var, -1, 1);
						ClearVariableArenaRef();
						lua_pop(L, 1);
						stack.upvalueVariables.push_back(var);
					}
					// pop function
					lua_pop(L, 1);
				}
			}

			level++;
		}

		// TODO
		lua_State *PL = manager->extension.QueryParentThread(L);

		if (PL != nullptr) {
			L = PL;
		} else {
			break;
		}
	}

	SetCurrentState(prevCurrentL);

	return false;
}